

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_test_datatype_sizes(int verb)

{
  uint local_20;
  int local_1c;
  int errs;
  int c;
  int ssize;
  int nbyper;
  int tablen;
  int verb_local;
  
  ssize = 0x2b;
  local_20 = 0;
  nbyper = verb;
  for (local_1c = 0; local_1c < ssize; local_1c = local_1c + 1) {
    errs = -1;
    c = -1;
    nifti_datatype_sizes(nifti_type_list[local_1c].type,&c,&errs);
    if ((((c < 0) || (errs < 0)) || (c != nifti_type_list[local_1c].nbyper)) ||
       (errs != nifti_type_list[local_1c].swapsize)) {
      if ((nbyper != 0) || (2 < g_opts.debug)) {
        fprintf(_stderr,"** type mismatch: %s, %d, %d, %d : %d, %d\n",nifti_type_list[local_1c].name
                ,(ulong)(uint)nifti_type_list[local_1c].type,
                (ulong)(uint)nifti_type_list[local_1c].nbyper,
                (ulong)(uint)nifti_type_list[local_1c].swapsize,c,errs);
      }
      local_20 = local_20 + 1;
    }
  }
  if (local_20 == 0) {
    if ((nbyper != 0) || (1 < g_opts.debug)) {
      fprintf(_stderr,"-- nifti_test_datatype_sizes: all OK\n");
    }
  }
  else {
    fprintf(_stderr,"** nifti_test_datatype_sizes: found %d errors\n",(ulong)local_20);
  }
  return local_20;
}

Assistant:

int nifti_test_datatype_sizes(int verb)
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int nbyper, ssize;
    int c, errs = 0;

    for( c = 0; c < tablen; c++ )
    {
        nbyper = ssize = -1;
        nifti_datatype_sizes(nifti_type_list[c].type, &nbyper, &ssize);
        if( nbyper < 0 || ssize < 0 ||
                nbyper != nifti_type_list[c].nbyper ||
                ssize != nifti_type_list[c].swapsize )
        {
            if( verb || g_opts.debug > 2 )
                fprintf(stderr, "** type mismatch: %s, %d, %d, %d : %d, %d\n",
                    nifti_type_list[c].name, nifti_type_list[c].type,
                    nifti_type_list[c].nbyper, nifti_type_list[c].swapsize,
                    nbyper, ssize);
            errs++;
        }
    }

    if( errs )
        fprintf(stderr,"** nifti_test_datatype_sizes: found %d errors\n",errs);
    else if( verb || g_opts.debug > 1 )
        fprintf(stderr,"-- nifti_test_datatype_sizes: all OK\n");

    return errs;
}